

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O3

boolean compress_output(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  int iVar4;
  int iVar5;
  jpeg_c_coef_controller *pjVar6;
  jpeg_component_info *pjVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  boolean bVar11;
  JBLOCKARRAY ppaJVar12;
  JBLOCKROW paJVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  JBLOCKARRAY buffer [4];
  JBLOCKROW MCU_buffer [10];
  long alStack_a8 [4];
  JBLOCKROW local_88 [11];
  
  pjVar6 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  JVar2 = cinfo->MCUs_per_row;
  if (0 < cinfo->comps_in_scan) {
    lVar19 = 0;
    do {
      JVar3 = cinfo->cur_comp_info[lVar19]->v_samp_factor;
      ppaJVar12 = (*cinfo->mem->access_virt_barray)
                            ((j_common_ptr)cinfo,
                             *(jvirt_barray_ptr *)
                              (pjVar6[2].start_pass +
                              (long)cinfo->cur_comp_info[lVar19]->component_index * 8),
                             *(int *)&pjVar6[1].start_pass * JVar3,JVar3,0);
      alStack_a8[lVar19] = (long)ppaJVar12;
      lVar19 = lVar19 + 1;
    } while (lVar19 < cinfo->comps_in_scan);
  }
  lVar19 = (long)*(int *)&pjVar6[1].compress_data;
  iVar8 = *(int *)((long)&pjVar6[1].compress_data + 4);
  if (*(int *)&pjVar6[1].compress_data < iVar8) {
    uVar18 = *(uint *)((long)&pjVar6[1].start_pass + 4);
    uVar14 = cinfo->MCUs_per_row;
    do {
      if (uVar18 < uVar14) {
        do {
          iVar8 = cinfo->comps_in_scan;
          if (0 < (long)iVar8) {
            lVar15 = 0;
            iVar17 = 0;
            do {
              pjVar7 = cinfo->cur_comp_info[lVar15];
              iVar4 = pjVar7->MCU_width;
              iVar9 = iVar4;
              if (JVar2 - 1 <= uVar18) {
                iVar9 = pjVar7->last_col_width;
              }
              iVar5 = pjVar7->MCU_height;
              if (0 < (long)iVar5) {
                uVar14 = *(uint *)&pjVar6[1].start_pass;
                lVar16 = 0;
                do {
                  if (uVar14 < JVar1 - 1) {
                    if (iVar9 < 1) {
                      iVar10 = 0;
                    }
                    else {
LAB_0010dcd4:
                      paJVar13 = (JBLOCKROW)
                                 (*(long *)(alStack_a8[lVar15] + (lVar16 + lVar19) * 8) +
                                 (ulong)(iVar4 * uVar18) * 0x80);
                      lVar20 = 0;
                      do {
                        local_88[iVar17 + lVar20] = paJVar13;
                        paJVar13 = paJVar13 + 1;
                        lVar20 = lVar20 + 1;
                      } while (iVar9 != (int)lVar20);
                      iVar17 = iVar17 + (int)lVar20;
                      iVar10 = iVar9;
                    }
                  }
                  else {
                    iVar10 = 0;
                    if ((lVar16 + lVar19 < (long)pjVar7->last_row_height) && (iVar10 = 0, 0 < iVar9)
                       ) goto LAB_0010dcd4;
                  }
                  if (iVar10 < iVar4) {
                    lVar20 = 0;
                    do {
                      paJVar13 = (JBLOCKROW)(&pjVar6[2].compress_data)[iVar17 + lVar20];
                      local_88[iVar17 + lVar20] = paJVar13;
                      (*paJVar13)[0] = *(JCOEF *)alStack_a8[(long)iVar17 + lVar20 + 3];
                      lVar20 = lVar20 + 1;
                    } while (iVar4 - iVar10 != (int)lVar20);
                    iVar17 = iVar17 + (int)lVar20;
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 != iVar5);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != iVar8);
          }
          bVar11 = (*cinfo->entropy->encode_mcu)(cinfo,local_88);
          if (bVar11 == 0) {
            *(int *)&pjVar6[1].compress_data = (int)lVar19;
            *(uint *)((long)&pjVar6[1].start_pass + 4) = uVar18;
            return 0;
          }
          uVar18 = uVar18 + 1;
          uVar14 = cinfo->MCUs_per_row;
        } while (uVar18 < uVar14);
        iVar8 = *(int *)((long)&pjVar6[1].compress_data + 4);
      }
      *(undefined4 *)((long)&pjVar6[1].start_pass + 4) = 0;
      lVar19 = lVar19 + 1;
      uVar18 = 0;
    } while (lVar19 < iVar8);
  }
  *(int *)&pjVar6[1].start_pass = *(int *)&pjVar6[1].start_pass + 1;
  start_iMCU_row(cinfo);
  return 1;
}

Assistant:

METHODDEF(boolean)
compress_output (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, blockcnt;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW MCU_buffer[C_MAX_BLOCKS_IN_MCU];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, FALSE);
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						: compptr->last_col_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (coef->iMCU_row_num < last_iMCU_row ||
	      yindex+yoffset < compptr->last_row_height) {
	    /* Fill in pointers to real blocks in this row */
	    buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	    for (xindex = 0; xindex < blockcnt; xindex++)
	      MCU_buffer[blkn++] = buffer_ptr++;
	  } else {
	    /* At bottom of image, need a whole row of dummy blocks */
	    xindex = 0;
	  }
	  /* Fill in any dummy blocks needed in this row.
	   * Dummy blocks are filled in the same way as in jccoefct.c:
	   * all zeroes in the AC entries, DC entries equal to previous
	   * block's DC value.  The init routine has already zeroed the
	   * AC entries, so we need only set the DC entries correctly.
	   */
	  for (; xindex < compptr->MCU_width; xindex++) {
	    MCU_buffer[blkn] = coef->dummy_buffer[blkn];
	    MCU_buffer[blkn][0][0] = MCU_buffer[blkn-1][0][0];
	    blkn++;
	  }
	}
      }
      /* Try to write the MCU. */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}